

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::im2col_sgemm_pack8to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int *piVar16;
  uint uVar17;
  int iVar18;
  undefined1 (*pauVar19) [16];
  undefined8 *puVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [32];
  undefined8 *puVar26;
  uint uVar27;
  undefined1 (*pauVar28) [16];
  byte bVar29;
  ulong uVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  undefined1 (*pauVar36) [32];
  int q;
  ulong uVar37;
  long lVar38;
  bool bVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 local_98 [64];
  size_t local_58;
  ulong local_48;
  ulong local_40;
  Mat *local_38;
  
  uVar2 = bottom_im2col->w;
  uVar24 = (ulong)(int)uVar2;
  uVar3 = bottom_im2col->h;
  uVar21 = bottom_im2col->c;
  local_40 = (ulong)(uint)top_blob->c;
  local_58 = 0;
  local_98._0_8_ = (void *)0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._16_8_ = 0;
  local_98._24_4_ = 0;
  local_98._32_8_ = (Allocator *)0x0;
  local_98._40_4_ = 0;
  local_98._44_4_ = 0;
  local_98._48_12_ = SUB1612((undefined1  [16])0x0,4);
  if ((long)uVar24 < 4) {
    uVar17 = uVar2;
    uVar27 = uVar3;
    if (1 < (int)uVar2) {
      uVar27 = uVar3 * 2;
      uVar17 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar17 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    uVar27 = uVar3 * 4;
  }
  local_38 = top_blob;
  Mat::create((Mat *)local_98,uVar27,uVar21,uVar17,8,8,opt->workspace_allocator);
  uVar22 = 0;
  uVar17 = 0;
  if (0 < (int)uVar3) {
    uVar17 = uVar3;
  }
  uVar33 = 0;
  if (0 < (int)uVar21) {
    uVar33 = (ulong)uVar21;
  }
  uVar23 = (ulong)(uint)((int)uVar2 >> 2);
  if ((int)uVar2 >> 2 < 1) {
    uVar23 = uVar22;
  }
  for (uVar30 = 0; uVar30 != uVar23; uVar30 = uVar30 + 1) {
    pauVar36 = (undefined1 (*) [32])(local_58 * uVar30 * local_98._16_8_ + local_98._0_8_);
    for (uVar37 = 0; uVar37 != uVar33; uVar37 = uVar37 + 1) {
      pauVar25 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar37 + uVar22);
      uVar27 = uVar17;
      while (bVar39 = uVar27 != 0, uVar27 = uVar27 - 1, bVar39) {
        *pauVar36 = *pauVar25;
        pauVar36 = pauVar36 + 1;
        pauVar25 = (undefined1 (*) [32])(*pauVar25 + uVar24 * 8);
      }
    }
    uVar22 = uVar22 + 0x20;
  }
  uVar27 = uVar2 >> 1 & 1;
  lVar38 = (uVar24 & 0xfffffffffffffffc) << 3;
  for (uVar22 = 0; iVar18 = (int)(uVar24 & 0xfffffffffffffffc), uVar22 != uVar27;
      uVar22 = uVar22 + 1) {
    iVar18 = iVar18 + (int)uVar22 * 2;
    pauVar19 = (undefined1 (*) [16])
               ((long)((iVar18 % 4 >> 1) + iVar18 / 4) * local_58 * local_98._16_8_ + local_98._0_8_
               );
    for (uVar23 = 0; uVar23 != uVar33; uVar23 = uVar23 + 1) {
      pauVar28 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + lVar38);
      uVar31 = uVar17;
      while (bVar39 = uVar31 != 0, uVar31 = uVar31 - 1, bVar39) {
        *pauVar19 = *pauVar28;
        pauVar19 = pauVar19 + 1;
        pauVar28 = (undefined1 (*) [16])(*pauVar28 + uVar24 * 8);
      }
    }
    lVar38 = lVar38 + 0x10;
  }
  uVar22 = (ulong)(int)(iVar18 + uVar27 * 2);
  lVar38 = uVar22 * 8;
  for (; (long)uVar22 < (long)uVar24; uVar22 = uVar22 + 1) {
    uVar27 = (int)uVar22 >> 0x1f;
    uVar23 = (ulong)uVar27 << 0x20 | uVar22 & 0xffffffff;
    puVar20 = (undefined8 *)
              ((long)((int)((long)((ulong)uVar27 << 0x20 | uVar22 & 0xffffffff) % 2) +
                      (int)((long)uVar23 / 4) + (int)(char)((char)((long)uVar23 % 4) / '\x02')) *
               local_58 * local_98._16_8_ + local_98._0_8_);
    pvVar4 = bottom_im2col->data;
    for (uVar23 = 0; uVar23 != uVar33; uVar23 = uVar23 + 1) {
      puVar26 = (undefined8 *)
                ((long)pvVar4 + bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + lVar38);
      uVar27 = uVar17;
      while (bVar39 = uVar27 != 0, uVar27 = uVar27 - 1, bVar39) {
        *puVar20 = *puVar26;
        puVar20 = puVar20 + 1;
        puVar26 = puVar26 + uVar24;
      }
    }
    lVar38 = lVar38 + 8;
  }
  uVar33 = 0;
  uVar22 = (ulong)(uVar21 * uVar3);
  if ((int)(uVar21 * uVar3) < 1) {
    uVar22 = uVar33;
  }
  uVar23 = local_40 & 0xffffffff;
  if ((int)local_40 < 1) {
    uVar23 = uVar33;
  }
  auVar13 = vpmovsxbd_avx2(ZEXT816(0x60300000702));
  auVar14 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
  auVar15 = vpmovsxbd_avx2(ZEXT816(0x40100000500));
  for (; uVar33 != uVar23; uVar33 = uVar33 + 1) {
    pauVar36 = (undefined1 (*) [32])
               (local_38->cstep * uVar33 * local_38->elemsize + (long)local_38->data);
    lVar38 = 0;
    for (uVar30 = 0; (long)(uVar30 | 3) < (long)uVar24; uVar30 = uVar30 + 4) {
      lVar32 = kernel->cstep * uVar33 * kernel->elemsize;
      lVar34 = local_58 * local_98._16_8_ * lVar38;
      auVar42 = ZEXT1664((undefined1  [16])0x0);
      lVar35 = 0;
      auVar44 = ZEXT1664((undefined1  [16])0x0);
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      auVar47 = ZEXT1664((undefined1  [16])0x0);
      auVar49 = ZEXT1664((undefined1  [16])0x0);
      auVar51 = ZEXT1664((undefined1  [16])0x0);
      auVar53 = ZEXT1664((undefined1  [16])0x0);
      auVar55 = ZEXT1664((undefined1  [16])0x0);
      uVar37 = uVar22;
      while( true ) {
        iVar18 = (int)uVar37;
        uVar37 = (ulong)(iVar18 - 1);
        auVar52 = auVar53._0_32_;
        auVar54 = auVar55._0_32_;
        auVar48 = auVar49._0_32_;
        auVar50 = auVar51._0_32_;
        auVar40 = auVar45._0_32_;
        auVar46 = auVar47._0_32_;
        auVar41 = auVar42._0_32_;
        auVar43 = auVar44._0_32_;
        if (iVar18 == 0) break;
        auVar10 = vpmovsxbw_avx2(*(undefined1 (*) [16])(local_98._0_8_ + lVar35 + lVar34));
        auVar11 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar35 + lVar32));
        auVar12 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar35 + lVar32 + 0x10)
                                );
        auVar9 = vpmaddwd_avx2(auVar10,auVar11);
        auVar54 = vpaddd_avx2(auVar9,auVar54);
        auVar55 = ZEXT3264(auVar54);
        auVar9 = vpermq_avx2(auVar10,0x4e);
        auVar54 = vpmaddwd_avx2(auVar9,auVar11);
        auVar52 = vpaddd_avx2(auVar52,auVar54);
        auVar53 = ZEXT3264(auVar52);
        auVar52 = vpmaddwd_avx2(auVar10,auVar12);
        auVar50 = vpaddd_avx2(auVar50,auVar52);
        auVar51 = ZEXT3264(auVar50);
        auVar50 = vpmaddwd_avx2(auVar9,auVar12);
        auVar48 = vpaddd_avx2(auVar48,auVar50);
        auVar49 = ZEXT3264(auVar48);
        auVar50 = vpmovsxbw_avx2(*(undefined1 (*) [16])(local_98._0_8_ + lVar35 + lVar34 + 0x10));
        auVar48 = vpmaddwd_avx2(auVar11,auVar50);
        auVar46 = vpaddd_avx2(auVar48,auVar46);
        auVar47 = ZEXT3264(auVar46);
        auVar48 = vpermq_avx2(auVar50,0x4e);
        auVar46 = vpmaddwd_avx2(auVar48,auVar11);
        auVar40 = vpaddd_avx2(auVar46,auVar40);
        auVar45 = ZEXT3264(auVar40);
        auVar40 = vpmaddwd_avx2(auVar12,auVar50);
        auVar43 = vpaddd_avx2(auVar40,auVar43);
        auVar44 = ZEXT3264(auVar43);
        auVar43 = vpmaddwd_avx2(auVar48,auVar12);
        auVar41 = vpaddd_avx2(auVar43,auVar41);
        auVar42 = ZEXT3264(auVar41);
        lVar35 = lVar35 + 0x20;
      }
      auVar9 = vpunpckldq_avx2(auVar54,auVar52);
      auVar10 = vpunpckldq_avx2(auVar50,auVar48);
      auVar52 = vpunpckhdq_avx2(auVar54,auVar52);
      auVar48 = vpunpckhdq_avx2(auVar50,auVar48);
      auVar54 = vpunpckldq_avx2(auVar46,auVar40);
      auVar11 = vpunpckldq_avx2(auVar43,auVar41);
      auVar46 = vpunpckhdq_avx2(auVar46,auVar40);
      auVar50 = vpunpckhdq_avx2(auVar43,auVar41);
      auVar40 = vpmovsxbd_avx2(ZEXT816(0x603000007020000));
      auVar41 = vpermd_avx2(auVar40,auVar10);
      auVar43 = vpermd_avx2(auVar13,auVar9);
      auVar41 = vpblendd_avx2(auVar43,auVar41,0xcc);
      auVar43 = vpermd_avx2(auVar14,auVar10);
      auVar9 = vpermd_avx2(auVar15,auVar9);
      auVar43 = vpblendd_avx2(auVar9,auVar43,0xcc);
      auVar41 = vpaddd_avx2(auVar43,auVar41);
      auVar43 = vpermd_avx2(auVar40,auVar48);
      auVar9 = vpermd_avx2(auVar13,auVar52);
      auVar43 = vpblendd_avx2(auVar9,auVar43,0xcc);
      auVar48 = vpermd_avx2(auVar14,auVar48);
      auVar52 = vpermd_avx2(auVar15,auVar52);
      auVar48 = vpblendd_avx2(auVar52,auVar48,0xcc);
      auVar43 = vpaddd_avx2(auVar43,auVar48);
      auVar41 = vpaddd_avx2(auVar41,auVar43);
      auVar43 = vpermd_avx2(auVar40,auVar11);
      auVar48 = vpermd_avx2(auVar13,auVar54);
      auVar43 = vpblendd_avx2(auVar48,auVar43,0xcc);
      auVar48 = vpermd_avx2(auVar14,auVar11);
      auVar52 = vpermd_avx2(auVar15,auVar54);
      auVar48 = vpblendd_avx2(auVar52,auVar48,0xcc);
      auVar43 = vpaddd_avx2(auVar48,auVar43);
      auVar40 = vpermd_avx2(auVar40,auVar50);
      auVar48 = vpermd_avx2(auVar13,auVar46);
      auVar40 = vpblendd_avx2(auVar48,auVar40,0xcc);
      auVar48 = vpermd_avx2(auVar14,auVar50);
      auVar46 = vpermd_avx2(auVar15,auVar46);
      auVar46 = vpblendd_avx2(auVar46,auVar48,0xcc);
      auVar40 = vpaddd_avx2(auVar40,auVar46);
      auVar43 = vpaddd_avx2(auVar43,auVar40);
      *pauVar36 = auVar41;
      pauVar36[1] = auVar43;
      pauVar36 = pauVar36 + 2;
      lVar38 = lVar38 + 1;
    }
    bVar29 = 0;
    for (; (int)((uint)uVar30 | 1) < (int)uVar2; uVar30 = (ulong)((uint)uVar30 + 2)) {
      lVar38 = kernel->cstep * uVar33 * kernel->elemsize;
      auVar42 = ZEXT1664((undefined1  [16])0x0);
      lVar32 = 0;
      auVar44 = ZEXT1664((undefined1  [16])0x0);
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      auVar47 = ZEXT1664((undefined1  [16])0x0);
      uVar37 = uVar22;
      while( true ) {
        iVar18 = (int)uVar37;
        uVar37 = (ulong)(iVar18 - 1);
        auVar41 = auVar42._0_32_;
        auVar43 = auVar44._0_32_;
        auVar40 = auVar45._0_32_;
        auVar46 = auVar47._0_32_;
        if (iVar18 == 0) break;
        auVar50 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                  (local_98._0_8_ +
                                  lVar32 + local_58 * local_98._16_8_ *
                                           (ulong)((bVar29 & 1) + ((uint)(uVar30 >> 2) & 0x3fffffff)
                                                  )));
        auVar52 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar32 * 2 + lVar38));
        auVar54 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                  ((long)kernel->data + lVar32 * 2 + lVar38 + 0x10));
        auVar48 = vpmaddwd_avx2(auVar52,auVar50);
        auVar41 = vpaddd_avx2(auVar48,auVar41);
        auVar42 = ZEXT3264(auVar41);
        auVar48 = vpermq_avx2(auVar50,0x4e);
        auVar41 = vpmaddwd_avx2(auVar48,auVar52);
        auVar41 = vpaddd_avx2(auVar41,auVar43);
        auVar44 = ZEXT3264(auVar41);
        auVar41 = vpmaddwd_avx2(auVar54,auVar50);
        auVar41 = vpaddd_avx2(auVar41,auVar40);
        auVar45 = ZEXT3264(auVar41);
        auVar41 = vpmaddwd_avx2(auVar48,auVar54);
        auVar41 = vpaddd_avx2(auVar41,auVar46);
        auVar47 = ZEXT3264(auVar41);
        lVar32 = lVar32 + 0x10;
      }
      auVar50 = vpunpckldq_avx2(auVar41,auVar43);
      auVar52 = vpunpckldq_avx2(auVar40,auVar46);
      auVar48 = vpunpckhdq_avx2(auVar41,auVar43);
      auVar40 = vpunpckhdq_avx2(auVar40,auVar46);
      auVar43 = vpmovsxbd_avx2(ZEXT816(0x603000007020000));
      auVar41 = vpermd_avx2(auVar43,auVar52);
      auVar46 = vpermd_avx2(auVar13,auVar50);
      auVar41 = vpblendd_avx2(auVar46,auVar41,0xcc);
      auVar46 = vpermd_avx2(auVar14,auVar52);
      auVar50 = vpermd_avx2(auVar15,auVar50);
      auVar46 = vpblendd_avx2(auVar50,auVar46,0xcc);
      auVar41 = vpaddd_avx2(auVar46,auVar41);
      auVar43 = vpermd_avx2(auVar43,auVar40);
      auVar46 = vpermd_avx2(auVar13,auVar48);
      auVar43 = vpblendd_avx2(auVar46,auVar43,0xcc);
      auVar40 = vpermd_avx2(auVar14,auVar40);
      auVar46 = vpermd_avx2(auVar15,auVar48);
      auVar40 = vpblendd_avx2(auVar46,auVar40,0xcc);
      auVar43 = vpaddd_avx2(auVar43,auVar40);
      auVar41 = vpaddd_avx2(auVar41,auVar43);
      *pauVar36 = auVar41;
      pauVar36 = pauVar36 + 1;
      bVar29 = bVar29 + 1;
    }
    while( true ) {
      uVar21 = (uint)uVar30;
      if ((int)uVar2 <= (int)uVar21) break;
      pauVar19 = (undefined1 (*) [16])
                 (kernel->cstep * uVar33 * kernel->elemsize + (long)kernel->data);
      auVar42 = ZEXT1664((undefined1  [16])0x0);
      auVar44 = ZEXT1664((undefined1  [16])0x0);
      for (lVar38 = 0; (int)uVar22 != (int)lVar38; lVar38 = lVar38 + 1) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)(local_98._0_8_ +
                                 lVar38 * 8 +
                                 local_58 * local_98._16_8_ *
                                 (ulong)((uVar21 & 1) + ((uint)(uVar30 >> 2) & 0x3fffffff) +
                                        (uint)((uVar21 >> 1 & 1) != 0)));
        auVar1 = vpmovsxbw_avx(auVar1);
        auVar41 = vpmovsxbw_avx2(*pauVar19);
        auVar43 = vpmovsxbw_avx2(pauVar19[1]);
        auVar40._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar1;
        auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
        auVar41 = vpmaddwd_avx2(auVar40,auVar41);
        auVar41 = vpaddd_avx2(auVar41,auVar42._0_32_);
        auVar42 = ZEXT3264(auVar41);
        auVar41 = vpmaddwd_avx2(auVar40,auVar43);
        auVar41 = vpaddd_avx2(auVar41,auVar44._0_32_);
        auVar44 = ZEXT3264(auVar41);
        pauVar19 = pauVar19 + 2;
      }
      auVar1 = vpunpckldq_avx(auVar42._0_16_,auVar42._16_16_);
      auVar7 = vpunpckldq_avx(auVar44._0_16_,auVar44._16_16_);
      auVar5 = vpunpckhdq_avx(auVar42._0_16_,auVar42._16_16_);
      auVar6 = vpunpckhdq_avx(auVar44._0_16_,auVar44._16_16_);
      auVar8 = vpunpcklqdq_avx(auVar1,auVar7);
      auVar1 = vpunpckhqdq_avx(auVar1,auVar7);
      auVar1 = vpaddd_avx(auVar8,auVar1);
      auVar7 = vpunpcklqdq_avx(auVar5,auVar6);
      auVar5 = vpunpckhqdq_avx(auVar5,auVar6);
      auVar5 = vpaddd_avx(auVar5,auVar7);
      auVar1 = vpaddd_avx(auVar1,auVar5);
      *(undefined1 (*) [16])*pauVar36 = auVar1;
      pauVar36 = (undefined1 (*) [32])(*pauVar36 + 0x10);
      uVar30 = (ulong)(uVar21 + 1);
    }
  }
  piVar16 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      local_48 = (ulong)uVar3;
      if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
        free((void *)local_98._0_8_);
      }
      else {
        (*(*(_func_int ***)local_98._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}